

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  long in_FS_OFFSET;
  
  iVar1 = CurrentThread::tid();
  *this->tid_ = iVar1;
  this->tid_ = (pid_t *)0x0;
  CountDownLatch::countDown(this->latch_);
  this->latch_ = (CountDownLatch *)0x0;
  *(pointer *)(in_FS_OFFSET + -0x48) = (this->name_)._M_dataplus._M_p;
  prctl(0xf);
  std::function<void_()>::operator()(&this->func_);
  return;
}

Assistant:

void runInThread() {
        *tid_ = CurrentThread::tid();
        tid_ = NULL;
        latch_->countDown();
        latch_ = NULL;

        CurrentThread::t_threadName = name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);
        func_();
        
    }